

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_18::DoInlining::runOnFunction(DoInlining *this,Module *module,Function *func)

{
  size_type __bkt;
  char *__c;
  undefined8 *puVar1;
  __node_ptr p_Var2;
  __hash_code __code;
  const_iterator __begin2;
  undefined8 *puVar3;
  undefined1 auStack_48 [8];
  InliningAction action;
  
  __bkt = (this->chosenActions->_M_h)._M_bucket_count;
  __c = (func->super_Importable).super_Named.name.super_IString.str._M_str;
  p_Var2 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(this->chosenActions->_M_h)._M_buckets,__bkt,
                          (key_type *)((ulong)__c % __bkt),(__hash_code)__c);
  if (p_Var2 == (__node_ptr)0x0) {
    __assert_fail("iter != chosenActions.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                  ,0x29c,
                  "virtual void wasm::(anonymous namespace)::DoInlining::runOnFunction(Module *, Function *)"
                 );
  }
  puVar3 = *(undefined8 **)
            ((long)&(p_Var2->
                    super__Hash_node_value<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>
                    ._M_storage._M_storage + 0x10);
  puVar1 = *(undefined8 **)
            ((long)&(p_Var2->
                    super__Hash_node_value<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>
                    ._M_storage._M_storage + 0x18);
  if (puVar3 != puVar1) {
    do {
      action.contents = (Function *)puVar3[2];
      auStack_48 = (undefined1  [8])*puVar3;
      action.callSite = (Expression **)puVar3[1];
      doCodeInlining(module,func,(InliningAction *)auStack_48,&((this->super_Pass).runner)->options)
      ;
      puVar3 = puVar3 + 3;
    } while (puVar3 != puVar1);
    updateAfterInlining(module,func);
    return;
  }
  __assert_fail("!actions.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                ,0x29e,
                "virtual void wasm::(anonymous namespace)::DoInlining::runOnFunction(Module *, Function *)"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    auto iter = chosenActions.find(func->name);
    // We must be called on a function that we actually want to inline into.
    assert(iter != chosenActions.end());
    const auto& actions = iter->second;
    assert(!actions.empty());

    // Inline all the code first, then update func once at the end (which saves
    // e.g. running ReFinalize after each action, of which there might be many).
    for (auto action : actions) {
      doCodeInlining(module, func, action, getPassOptions());
    }
    updateAfterInlining(module, func);
  }